

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O3

int SUNLinSolSetup_Band(SUNLinearSolver S,SUNMatrix A)

{
  long lVar1;
  void *pvVar2;
  sunindextype *p;
  long n;
  int iVar3;
  sunindextype sVar4;
  long lVar5;
  
  iVar3 = -1;
  if (S != (SUNLinearSolver)0x0 && A != (SUNMatrix)0x0) {
    iVar3 = SUNMatGetID(A);
    if (iVar3 == 1) {
      pvVar2 = A->content;
      p = *(sunindextype **)((long)S->content + 8);
      if (p != (sunindextype *)0x0 && *(realtype ***)((long)pvVar2 + 0x40) != (realtype **)0x0) {
        n = *(long *)((long)pvVar2 + 8);
        lVar1 = *(long *)((long)pvVar2 + 0x20) + *(long *)((long)pvVar2 + 0x18);
        lVar5 = n + -1;
        if (lVar1 < n) {
          lVar5 = lVar1;
        }
        if (lVar5 <= *(long *)((long)pvVar2 + 0x28)) {
          sVar4 = bandGBTRF(*(realtype ***)((long)pvVar2 + 0x40),n,*(long *)((long)pvVar2 + 0x18),
                            *(long *)((long)pvVar2 + 0x20),*(long *)((long)pvVar2 + 0x28),p);
          *(sunindextype *)((long)S->content + 0x10) = sVar4;
          return (uint)(0 < sVar4) << 3;
        }
      }
      *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffd;
      iVar3 = -3;
    }
    else {
      *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffe;
      iVar3 = -2;
    }
  }
  return iVar3;
}

Assistant:

int SUNLinSolSetup_Band(SUNLinearSolver S, SUNMatrix A)
{
  realtype **A_cols;
  sunindextype *pivots;

  /* check for valid inputs */
  if ( (A == NULL) || (S == NULL) ) 
    return(SUNLS_MEM_NULL);
  
  /* Ensure that A is a band matrix */
  if (SUNMatGetID(A) != SUNMATRIX_BAND) {
    LASTFLAG(S) = SUNLS_ILL_INPUT;
    return(LASTFLAG(S));
  }
  
  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SM_COLS_B(A);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(LASTFLAG(S));
  }

  /* ensure that storage upper bandwidth is sufficient for fill-in */
  if (SM_SUBAND_B(A) < SUNMIN(SM_COLUMNS_B(A)-1, SM_UBAND_B(A) + SM_LBAND_B(A))) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(LASTFLAG(S));
  }
  
  /* perform LU factorization of input matrix */
  LASTFLAG(S) = bandGBTRF(A_cols, SM_COLUMNS_B(A), SM_UBAND_B(A),
			  SM_LBAND_B(A), SM_SUBAND_B(A), pivots);
  
  /* store error flag (if nonzero, that row encountered zero-valued pivod) */
  if (LASTFLAG(S) > 0)
    return(SUNLS_LUFACT_FAIL);
  return(SUNLS_SUCCESS);
}